

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaL_loadfile(lua_State *L,char *filename)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  StkId pTVar4;
  StkId pTVar5;
  char *pcVar6;
  uint idx;
  LoadF lf;
  undefined4 local_2040 [2];
  FILE *local_2038;
  
  iVar1 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  idx = iVar1 + 1;
  local_2040[0] = 0;
  if (filename == (char *)0x0) {
    lua_pushlstring(L,"=stdin",6);
    local_2038 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    local_2038 = fopen(filename,"r");
    if (local_2038 == (FILE *)0x0) {
      pcVar6 = "open";
      goto LAB_00103be6;
    }
  }
  iVar2 = getc(local_2038);
  if (iVar2 == 0x23) {
    local_2040[0] = 1;
    do {
      iVar2 = getc(local_2038);
      if (iVar2 == -1) goto LAB_00103acc;
    } while (iVar2 != 10);
    iVar2 = getc(local_2038);
  }
LAB_00103acc:
  if ((filename != (char *)0x0) && (iVar2 == 0x1b)) {
    local_2038 = freopen(filename,"rb",local_2038);
    if (local_2038 == (FILE *)0x0) {
      pcVar6 = "reopen";
      goto LAB_00103be6;
    }
    do {
      iVar2 = getc(local_2038);
      if (iVar2 == 0x1b) break;
    } while (iVar2 != -1);
    local_2040[0] = 0;
  }
  ungetc(iVar2,local_2038);
  pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,local_2040,pcVar6);
  __stream = local_2038;
  iVar3 = ferror(local_2038);
  if (filename != (char *)0x0) {
    fclose(__stream);
  }
  if (iVar3 == 0) {
    lua_remove(L,idx);
    return iVar2;
  }
  if (iVar1 < -1) {
    pTVar4 = L->top + (long)(int)idx + 1;
  }
  else {
    pTVar4 = L->base + idx;
    pTVar5 = L->top;
    if (pTVar5 < pTVar4) {
      do {
        pTVar5->tt = 0;
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 < pTVar4);
      L->top = pTVar5;
    }
  }
  L->top = pTVar4;
  pcVar6 = "read";
LAB_00103be6:
  errfile(L,pcVar6,idx);
  return 6;
}

Assistant:

static int luaL_loadfile(lua_State*L,const char*filename){
LoadF lf;
int status,readstatus;
int c;
int fnameindex=lua_gettop(L)+1;
lf.extraline=0;
if(filename==NULL){
lua_pushliteral(L,"=stdin");
lf.f=stdin;
}
else{
lua_pushfstring(L,"@%s",filename);
lf.f=fopen(filename,"r");
if(lf.f==NULL)return errfile(L,"open",fnameindex);
}
c=getc(lf.f);
if(c=='#'){
lf.extraline=1;
while((c=getc(lf.f))!=EOF&&c!='\n');
if(c=='\n')c=getc(lf.f);
}
if(c=="\033Lua"[0]&&filename){
lf.f=freopen(filename,"rb",lf.f);
if(lf.f==NULL)return errfile(L,"reopen",fnameindex);
while((c=getc(lf.f))!=EOF&&c!="\033Lua"[0]);
lf.extraline=0;
}
ungetc(c,lf.f);
status=lua_load(L,getF,&lf,lua_tostring(L,-1));
readstatus=ferror(lf.f);
if(filename)fclose(lf.f);
if(readstatus){
lua_settop(L,fnameindex);
return errfile(L,"read",fnameindex);
}
lua_remove(L,fnameindex);
return status;
}